

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mode_setting.cpp
# Opt level: O2

spv_result_t spvtools::val::ValidateFloatControls2(ValidationState_t *_)

{
  uint32_t *puVar1;
  pointer pIVar2;
  pointer puVar3;
  pointer ppVar4;
  Decoration DVar5;
  uint id;
  FPFastMathModeMask FVar6;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_> *this;
  size_type sVar7;
  Instruction *pIVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  size_type sVar10;
  value_type *__v;
  pointer puVar11;
  char *__s;
  uint32_t *puVar12;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> *pair;
  pointer ppVar13;
  Instruction *inst;
  pointer this_00;
  __ireturn_type _Var14;
  Instruction *inst_1;
  uint entry_point_1;
  vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
  worklist;
  unordered_set<const_spvtools::val::Instruction_*,_std::hash<const_spvtools::val::Instruction_*>,_std::equal_to<const_spvtools::val::Instruction_*>,_std::allocator<const_spvtools::val::Instruction_*>_>
  visited;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  fp_fast_math_default_entry_points;
  string dec;
  uint entry_point;
  undefined4 uStack_204;
  Decoration local_200;
  spv_result_t local_38;
  
  fp_fast_math_default_entry_points._M_h._M_buckets =
       &fp_fast_math_default_entry_points._M_h._M_single_bucket;
  fp_fast_math_default_entry_points._M_h._M_bucket_count = 1;
  fp_fast_math_default_entry_points._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  fp_fast_math_default_entry_points._M_h._M_element_count = 0;
  fp_fast_math_default_entry_points._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  fp_fast_math_default_entry_points._M_h._M_rehash_policy._M_next_resize = 0;
  fp_fast_math_default_entry_points._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar1 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar12 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start; puVar12 != puVar1; puVar12 = puVar12 + 1)
  {
    _entry_point = (Instruction *)CONCAT44(uStack_204,*puVar12);
    this = ValidationState_t::GetExecutionModes(_,*puVar12);
    if (this != (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                 *)0x0) {
      visited._M_h._M_buckets = (__buckets_ptr)CONCAT44(visited._M_h._M_buckets._4_4_,0x178c);
      sVar7 = std::
              set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
              ::count(this,(key_type *)&visited);
      if (sVar7 != 0) {
        std::__detail::
        _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((__ireturn_type *)&fp_fast_math_default_entry_points,
                 (_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&entry_point,__v);
      }
    }
  }
  worklist.
  super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  worklist.
  super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  worklist.
  super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar2 = (_->ordered_instructions_).
           super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (_->ordered_instructions_).
                 super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pIVar2; this_00 = this_00 + 1
      ) {
    if ((this_00->inst_).opcode == 0x47) {
      DVar5 = Instruction::GetOperandAs<spv::Decoration>(this_00,1);
      id = Instruction::GetOperandAs<unsigned_int>(this_00,0);
      pIVar8 = ValidationState_t::FindDef(_,id);
      if (DVar5 == DecorationFPFastMathMode) {
        FVar6 = Instruction::GetOperandAs<spv::FPFastMathModeMask>(this_00,2);
        if ((FVar6 & Fast) != MaskNone) {
          local_200 = DecorationFPFastMathMode;
          goto LAB_00565ab0;
        }
      }
      else if (DVar5 == DecorationNoContraction) {
        local_200 = DecorationNoContraction;
LAB_00565ab0:
        _entry_point = pIVar8;
        std::
        vector<std::pair<spvtools::val::Instruction_const*,spv::Decoration>,std::allocator<std::pair<spvtools::val::Instruction_const*,spv::Decoration>>>
        ::emplace_back<std::pair<spvtools::val::Instruction_const*,spv::Decoration>>
                  ((vector<std::pair<spvtools::val::Instruction_const*,spv::Decoration>,std::allocator<std::pair<spvtools::val::Instruction_const*,spv::Decoration>>>
                    *)&worklist,
                   (pair<const_spvtools::val::Instruction_*,_spv::Decoration> *)&entry_point);
      }
    }
  }
  visited._M_h._M_buckets = &visited._M_h._M_single_bucket;
  visited._M_h._M_bucket_count = 1;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count = 0;
  visited._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  visited._M_h._M_single_bucket = (__node_base_ptr)0x0;
LAB_00565afe:
  do {
    do {
      if (worklist.
          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          worklist.
          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_38 = SPV_SUCCESS;
LAB_00565c27:
        std::
        _Hashtable<const_spvtools::val::Instruction_*,_const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::Instruction_*>,_std::hash<const_spvtools::val::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&visited._M_h);
        std::
        _Vector_base<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
        ::~_Vector_base(&worklist.
                         super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
                       );
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&fp_fast_math_default_entry_points._M_h);
        return local_38;
      }
      inst_1 = worklist.
               super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].first;
      DVar5 = worklist.
              super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].second;
      worklist.
      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           worklist.
           super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      _Var14 = std::__detail::
               _Insert_base<const_spvtools::val::Instruction_*,_const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::Instruction_*>,_std::hash<const_spvtools::val::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::insert((_Insert_base<const_spvtools::val::Instruction_*,_const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::Instruction_*>,_std::hash<const_spvtools::val::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&visited,&inst_1);
    } while (((undefined1  [16])_Var14 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
    if (inst_1->function_ != (Function *)0x0) {
      pvVar9 = ValidationState_t::FunctionEntryPoints(_,inst_1->function_->id_);
      puVar3 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar11 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start; puVar11 != puVar3;
          puVar11 = puVar11 + 1) {
        entry_point_1 = *puVar11;
        sVar10 = std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&fp_fast_math_default_entry_points._M_h,&entry_point_1);
        if (sVar10 != 0) {
          __s = "FPFastMathMode Fast";
          if (DVar5 == DecorationNoContraction) {
            __s = "NoContraction";
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&dec,__s,(allocator<char> *)&entry_point);
          ValidationState_t::diag((DiagnosticStream *)&entry_point,_,SPV_ERROR_INVALID_DATA,inst_1);
          std::operator<<((ostream *)&entry_point,(string *)&dec);
          std::operator<<((ostream *)&entry_point,
                          " cannot be used by an entry point with the FPFastMathDefault execution mode"
                         );
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&entry_point);
          std::__cxx11::string::_M_dispose();
          goto LAB_00565c27;
        }
      }
      goto LAB_00565afe;
    }
    ppVar4 = (inst_1->uses_).
             super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar13 = (inst_1->uses_).
                   super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar13 != ppVar4;
        ppVar13 = ppVar13 + 1) {
      _entry_point = ppVar13->first;
      local_200 = DVar5;
      std::
      vector<std::pair<spvtools::val::Instruction_const*,spv::Decoration>,std::allocator<std::pair<spvtools::val::Instruction_const*,spv::Decoration>>>
      ::emplace_back<std::pair<spvtools::val::Instruction_const*,spv::Decoration>>
                ((vector<std::pair<spvtools::val::Instruction_const*,spv::Decoration>,std::allocator<std::pair<spvtools::val::Instruction_const*,spv::Decoration>>>
                  *)&worklist,
                 (pair<const_spvtools::val::Instruction_*,_spv::Decoration> *)&entry_point);
    }
  } while( true );
}

Assistant:

spv_result_t ValidateFloatControls2(ValidationState_t& _) {
  std::unordered_set<uint32_t> fp_fast_math_default_entry_points;
  for (auto entry_point : _.entry_points()) {
    const auto* exec_modes = _.GetExecutionModes(entry_point);
    if (exec_modes &&
        exec_modes->count(spv::ExecutionMode::FPFastMathDefault)) {
      fp_fast_math_default_entry_points.insert(entry_point);
    }
  }

  std::vector<std::pair<const Instruction*, spv::Decoration>> worklist;
  for (const auto& inst : _.ordered_instructions()) {
    if (inst.opcode() != spv::Op::OpDecorate) {
      continue;
    }

    const auto decoration = inst.GetOperandAs<spv::Decoration>(1);
    const auto target_id = inst.GetOperandAs<uint32_t>(0);
    const auto target = _.FindDef(target_id);
    if (decoration == spv::Decoration::NoContraction) {
      worklist.push_back(std::make_pair(target, decoration));
    } else if (decoration == spv::Decoration::FPFastMathMode) {
      auto mask = inst.GetOperandAs<spv::FPFastMathModeMask>(2);
      if ((mask & spv::FPFastMathModeMask::Fast) !=
          spv::FPFastMathModeMask::MaskNone) {
        worklist.push_back(std::make_pair(target, decoration));
      }
    }
  }

  std::unordered_set<const Instruction*> visited;
  while (!worklist.empty()) {
    const auto inst = worklist.back().first;
    const auto decoration = worklist.back().second;
    worklist.pop_back();

    if (!visited.insert(inst).second) {
      continue;
    }

    const auto function = inst->function();
    if (function) {
      const auto& entry_points = _.FunctionEntryPoints(function->id());
      for (auto entry_point : entry_points) {
        if (fp_fast_math_default_entry_points.count(entry_point)) {
          const std::string dec = decoration == spv::Decoration::NoContraction
                                      ? "NoContraction"
                                      : "FPFastMathMode Fast";
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << dec
                 << " cannot be used by an entry point with the "
                    "FPFastMathDefault execution mode";
        }
      }
    } else {
      for (const auto& pair : inst->uses()) {
        worklist.push_back(std::make_pair(pair.first, decoration));
      }
    }
  }

  return SPV_SUCCESS;
}